

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::AlterInfo::Deserialize(AlterInfo *this,Deserializer *deserializer)

{
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> _Var1;
  undefined8 uVar2;
  AlterType AVar3;
  OnEntryNotFound OVar4;
  undefined1 uVar5;
  uint uVar6;
  int iVar7;
  pointer pAVar8;
  SerializationException *this_00;
  unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> result;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> schema;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> catalog;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> local_b0;
  undefined1 local_a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [15];
  char local_69;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [15];
  char local_49;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38 [15];
  char local_29;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_a8,deserializer);
    AVar3 = EnumUtil::FromString<duckdb::AlterType>((char *)local_a8._0_8_);
    uVar6 = (uint)AVar3;
    if ((AlterInfo *)local_a8._0_8_ != (AlterInfo *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_);
    }
  }
  else {
    uVar6 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar7 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"catalog");
  if ((char)iVar7 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_a8[0x10] = '\0';
    local_48._M_allocated_capacity = (size_type)local_38;
    local_38[0] = false;
    local_38[1] = (bool)local_a8[0x11];
    local_38[2] = (bool)local_a8[0x12];
    local_38[3] = (bool)local_a8[0x13];
    local_38[4] = (bool)local_a8[0x14];
    local_38[5] = (bool)local_a8[0x15];
    local_38[6] = (bool)local_a8[0x16];
    local_38[7] = (bool)local_a8[0x17];
    local_38[8] = (bool)local_a8[0x18];
    local_38[9] = (bool)local_a8[0x19];
    local_38[10] = (bool)local_a8[0x1a];
    local_38[0xb] = (bool)local_a8[0x1b];
    local_38[0xc] = (bool)local_a8[0x1c];
    local_38[0xd] = (bool)local_a8[0x1d];
    local_38[0xe] = (bool)local_a8[0x1e];
    local_29 = local_a8[0x1f];
    local_48._8_8_ = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_48,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar7 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"schema");
  if ((char)iVar7 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_a8[0x10] = '\0';
    local_68._M_allocated_capacity = (size_type)local_58;
    local_58[0] = 0;
    local_58._1_8_ = local_a8._17_8_;
    local_58._9_4_ = local_a8._25_4_;
    local_58._13_2_ = local_a8._29_2_;
    local_49 = local_a8[0x1f];
    local_68._8_8_ = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_68,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar7 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"name");
  if ((char)iVar7 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_a8[0x10] = '\0';
    local_88._M_allocated_capacity = (size_type)local_78;
    local_78[0] = 0;
    local_78._1_8_ = local_a8._17_8_;
    local_78._9_4_ = local_a8._25_4_;
    local_78._13_2_ = local_a8._29_2_;
    local_69 = local_a8[0x1f];
    local_88._8_8_ = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_88,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcc,"if_not_found");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_a8,deserializer);
    OVar4 = EnumUtil::FromString<duckdb::OnEntryNotFound>((char *)local_a8._0_8_);
    if ((AlterInfo *)local_a8._0_8_ != (AlterInfo *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_);
    }
  }
  else {
    iVar7 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    OVar4 = (OnEntryNotFound)iVar7;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar7 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcd,"allow_internal");
  if ((char)iVar7 == '\0') {
    uVar5 = false;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar7 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar5 = (undefined1)iVar7;
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  local_b0._M_head_impl = (AlterInfo *)0x0;
  switch(uVar6 & 0xff) {
  case 1:
    AlterTableInfo::Deserialize((AlterTableInfo *)local_a8,deserializer);
    break;
  case 2:
    AlterViewInfo::Deserialize((AlterViewInfo *)local_a8,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_a8._0_8_ = local_a8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"Unsupported type for deserialization of AlterInfo!","");
    SerializationException::SerializationException(this_00,(string *)local_a8);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case 4:
    ChangeOwnershipInfo::Deserialize((ChangeOwnershipInfo *)local_a8,deserializer);
    break;
  case 7:
    SetCommentInfo::Deserialize((SetCommentInfo *)local_a8,deserializer);
    break;
  case 8:
    SetColumnCommentInfo::Deserialize((SetColumnCommentInfo *)local_a8,deserializer);
  }
  uVar2 = local_a8._0_8_;
  _Var1._M_head_impl = local_b0._M_head_impl;
  local_a8._0_8_ = (_func_int **)0x0;
  local_b0._M_head_impl = (AlterInfo *)uVar2;
  if (_Var1._M_head_impl != (AlterInfo *)0x0) {
    (*((_Var1._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  pAVar8 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b0);
  ::std::__cxx11::string::operator=((string *)&pAVar8->catalog,(string *)local_48._M_local_buf);
  pAVar8 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b0);
  ::std::__cxx11::string::operator=((string *)&pAVar8->schema,(string *)local_68._M_local_buf);
  pAVar8 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b0);
  ::std::__cxx11::string::operator=((string *)&pAVar8->name,(string *)local_88._M_local_buf);
  pAVar8 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b0);
  (pAVar8->super_ParseInfo).field_0xa = OVar4;
  pAVar8 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b0);
  _Var1._M_head_impl = local_b0._M_head_impl;
  pAVar8->allow_internal = (bool)uVar5;
  local_b0._M_head_impl = (AlterInfo *)0x0;
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)_Var1._M_head_impl;
  if ((undefined1 *)local_88._M_allocated_capacity != local_78) {
    operator_delete((void *)local_88._M_allocated_capacity);
  }
  if ((undefined1 *)local_68._M_allocated_capacity != local_58) {
    operator_delete((void *)local_68._M_allocated_capacity);
  }
  if ((bool *)local_48._M_allocated_capacity != local_38) {
    operator_delete((void *)local_48._M_allocated_capacity);
  }
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> AlterInfo::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<AlterType>(200, "type");
	auto catalog = deserializer.ReadPropertyWithDefault<string>(201, "catalog");
	auto schema = deserializer.ReadPropertyWithDefault<string>(202, "schema");
	auto name = deserializer.ReadPropertyWithDefault<string>(203, "name");
	auto if_not_found = deserializer.ReadProperty<OnEntryNotFound>(204, "if_not_found");
	auto allow_internal = deserializer.ReadPropertyWithDefault<bool>(205, "allow_internal");
	unique_ptr<AlterInfo> result;
	switch (type) {
	case AlterType::ALTER_TABLE:
		result = AlterTableInfo::Deserialize(deserializer);
		break;
	case AlterType::ALTER_VIEW:
		result = AlterViewInfo::Deserialize(deserializer);
		break;
	case AlterType::CHANGE_OWNERSHIP:
		result = ChangeOwnershipInfo::Deserialize(deserializer);
		break;
	case AlterType::SET_COLUMN_COMMENT:
		result = SetColumnCommentInfo::Deserialize(deserializer);
		break;
	case AlterType::SET_COMMENT:
		result = SetCommentInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of AlterInfo!");
	}
	result->catalog = std::move(catalog);
	result->schema = std::move(schema);
	result->name = std::move(name);
	result->if_not_found = if_not_found;
	result->allow_internal = allow_internal;
	return std::move(result);
}